

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::LogUnusedDependency
          (DescriptorBuilder *this,FileDescriptorProto *proto,FileDescriptor *result)

{
  bool bVar1;
  iterator error;
  reference ppFVar2;
  undefined8 in_RDX;
  Message *in_RSI;
  string *in_RDI;
  DescriptorBuilder *unaff_retaddr;
  string error_message;
  const_iterator it;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_68 [24];
  undefined8 in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  _Self local_28;
  
  bVar1 = std::
          set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::empty((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   *)0x637068);
  if (!bVar1) {
    error = std::
            set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::begin(in_stack_ffffffffffffff68);
    while( true ) {
      local_28._M_node =
           (_Base_ptr)
           std::
           set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           ::end(in_stack_ffffffffffffff68);
      bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,&local_28);
      if (!bVar1) break;
      ppFVar2 = std::_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*>::operator*
                          ((_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*> *)
                           0x6370be);
      FileDescriptor::name_abi_cxx11_(*ppFVar2);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68;
      std::operator+(in_stack_ffffffffffffffb8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffffb0);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffff70);
      std::__cxx11::string::~string(local_68);
      ppFVar2 = std::_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*>::operator*
                          ((_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*> *)
                           0x63710b);
      in_stack_ffffffffffffff70 = FileDescriptor::name_abi_cxx11_(*ppFVar2);
      AddWarning(unaff_retaddr,in_RDI,in_RSI,(ErrorLocation)((ulong)in_RDX >> 0x20),
                 (string *)error._M_node);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
      std::_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*>::operator++
                ((_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*> *)
                 in_stack_ffffffffffffff70);
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::LogUnusedDependency(const FileDescriptorProto& proto,
                                            const FileDescriptor* result) {

  if (!unused_dependency_.empty()) {
    for (std::set<const FileDescriptor*>::const_iterator it =
             unused_dependency_.begin();
         it != unused_dependency_.end(); ++it) {
      // Log warnings for unused imported files.
      std::string error_message = "Import " + (*it)->name() + " but not used.";
      AddWarning((*it)->name(), proto, DescriptorPool::ErrorCollector::IMPORT,
                 error_message);
    }
  }
}